

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3FindInIndex(Parse *pParse,Expr *pX,u32 inFlags,int *prRhsHasNull,int *aiMap,int *piTab)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  ExprList *pEVar4;
  Table *pTab;
  Schema *pSVar5;
  Vdbe *pVVar6;
  SrcList *pSVar7;
  KeyInfo *pKVar8;
  u8 uVar9;
  char cVar10;
  byte bVar11;
  char cVar12;
  int iVar13;
  int iVar14;
  int addr;
  Select *pSVar15;
  CollSeq *pCVar16;
  Expr *pEVar17;
  Expr *pEVar18;
  int iVar19;
  Schema **ppSVar20;
  char *pcVar21;
  long lVar22;
  ulong uVar23;
  Op *pOVar24;
  uint uVar25;
  long lVar26;
  int iVar27;
  ExprList_item *pEVar28;
  int *piVar29;
  Index *pIdx;
  SrcList **ppSVar30;
  Op *pOVar31;
  ulong uVar32;
  bool bVar33;
  SelectDest dest;
  int local_c0;
  char local_b9;
  ExprList *local_b8;
  ulong local_b0;
  Expr *local_a8;
  int *local_a0;
  KeyInfo *local_98;
  int *local_90;
  Expr *local_88;
  Vdbe *local_80;
  ulong local_78;
  int local_6c;
  Walker local_68;
  int *local_38;
  
  local_b0 = (ulong)(uint)pParse->nTab;
  pParse->nTab = pParse->nTab + 1;
  local_90 = aiMap;
  local_38 = piTab;
  local_80 = sqlite3GetVdbe(pParse);
  iVar19 = 0;
  local_a8 = pX;
  if (prRhsHasNull == (int *)0x0) {
    local_a0 = (int *)0x0;
  }
  else {
    local_a0 = prRhsHasNull;
    if ((pX->flags & 0x800) != 0) {
      pEVar4 = ((pX->x).pSelect)->pEList;
      uVar25 = pEVar4->nExpr;
      if ((int)uVar25 < 1) {
        uVar32 = 0;
      }
      else {
        pEVar28 = pEVar4->a;
        uVar32 = 0;
        do {
          iVar13 = sqlite3ExprCanBeNull(pEVar28->pExpr);
          if (iVar13 != 0) goto LAB_001984f2;
          uVar32 = uVar32 + 1;
          pEVar28 = pEVar28 + 1;
        } while (uVar25 != uVar32);
        uVar32 = (ulong)uVar25;
      }
LAB_001984f2:
      if ((uint)uVar32 == uVar25) {
        local_a0 = (int *)0x0;
      }
    }
  }
  if (pParse->nErr == 0) {
    iVar19 = 0;
    if (((((((local_a8->flags & 0x820) == 0x800) &&
           (pSVar15 = (local_a8->x).pSelect, pSVar15->pPrior == (Select *)0x0)) &&
          ((pSVar15->selFlags & 9) == 0)) &&
         ((pSVar15->pLimit == (Expr *)0x0 && (pSVar15->pWhere == (Expr *)0x0)))) &&
        (pSVar7 = pSVar15->pSrc, pSVar7->nSrc == 1)) &&
       ((pSVar7->a[0].pSelect == (Select *)0x0 && ((pSVar7->a[0].pTab)->nModuleArg == 0)))) {
      lVar22 = (long)pSVar15->pEList->nExpr;
      if (0 < lVar22) {
        lVar26 = 0;
        do {
          if (**(char **)((long)&pSVar15->pEList->a[0].pExpr + lVar26) != -0x5e) goto LAB_00198627;
          lVar26 = lVar26 + 0x20;
        } while (lVar22 * 0x20 != lVar26);
      }
    }
    else {
LAB_00198627:
      pSVar15 = (Select *)0x0;
    }
    if (pSVar15 != (Select *)0x0) {
      local_b8 = pSVar15->pEList;
      uVar25 = local_b8->nExpr;
      pTab = pSVar15->pSrc->a[0].pTab;
      if (pTab->pSchema == (Schema *)0x0) {
        iVar19 = -0x4240;
      }
      else {
        iVar19 = -0x10000;
        ppSVar20 = &pParse->db->aDb->pSchema;
        do {
          iVar19 = iVar19 + 0x10000;
          pSVar5 = *ppSVar20;
          ppSVar20 = ppSVar20 + 4;
        } while (pSVar5 != pTab->pSchema);
        iVar19 = iVar19 >> 0x10;
      }
      sqlite3CodeVerifySchema(pParse,iVar19);
      sqlite3TableLock(pParse,iVar19,pTab->tnum,'\0',pTab->zName);
      pVVar6 = local_80;
      if ((uVar25 == 1) && ((local_b8->a[0].pExpr)->iColumn < 0)) {
        iVar13 = sqlite3VdbeAddOp3(local_80,0x11,0,0,0);
        sqlite3OpenTable(pParse,(int)local_b0,iVar19,pTab,0x6c);
        sqlite3VdbeExplain(pParse,'\0',"USING ROWID SEARCH ON TABLE %s FOR IN-OPERATOR",pTab->zName)
        ;
        if (pVVar6->db->mallocFailed == '\0') {
          iVar19 = pVVar6->nOp + -1;
          if (-1 < iVar13) {
            iVar19 = iVar13;
          }
          pOVar24 = pVVar6->aOp + iVar19;
        }
        else {
          pOVar24 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar24->p2 = pVVar6->nOp;
        iVar19 = 1;
      }
      else {
        if ((int)uVar25 < 1) {
LAB_00198959:
          pIdx = pTab->pIndex;
          if (pIdx != (Index *)0x0) {
            local_88 = (Expr *)CONCAT44(local_88._4_4_,iVar19);
            local_98 = (KeyInfo *)(long)(int)uVar25;
            local_78 = -1L << ((byte)uVar25 & 0x3f);
            local_b8 = (ExprList *)local_b8->a;
            do {
              uVar3 = pIdx->nColumn;
              iVar19 = 0;
              if (((((int)uVar25 <= (int)(uint)uVar3) && (iVar19 = 0, uVar3 < 0x3f)) &&
                  (iVar19 = 0, pIdx->pPartIdxWhere == (Expr *)0x0)) &&
                 (((inFlags & 4) == 0 ||
                  ((iVar19 = 0, (int)(uint)pIdx->nKeyCol <= (int)uVar25 &&
                   (((int)(uint)uVar3 <= (int)uVar25 || (iVar19 = 0, pIdx->onError != '\0')))))))) {
                if (0 < (int)uVar25) {
                  lVar22 = 0;
                  uVar32 = 0;
LAB_001989e5:
                  pEVar18 = sqlite3VectorFieldSubexpr(local_a8->pLeft,(int)lVar22);
                  pEVar17 = *(Expr **)&local_b8->a[lVar22 + -1].sortOrder;
                  pCVar16 = sqlite3BinaryCompareCollSeq(pParse,pEVar18,pEVar17);
                  uVar23 = 0;
LAB_00198a20:
                  if (pIdx->aiColumn[uVar23] != pEVar17->iColumn) goto LAB_00198a63;
                  if (pCVar16 != (CollSeq *)0x0) {
                    lVar26 = 0;
                    do {
                      bVar11 = pCVar16->zName[lVar26];
                      bVar2 = pIdx->azColl[uVar23][lVar26];
                      if (bVar11 == bVar2) {
                        if ((ulong)bVar11 == 0) goto LAB_00198a5e;
                      }
                      else if (""[bVar11] != ""[bVar2]) goto LAB_00198a5e;
                      lVar26 = lVar26 + 1;
                    } while( true );
                  }
                  goto LAB_00198a6e;
                }
                uVar32 = 0;
LAB_00198ade:
                pVVar6 = local_80;
                iVar19 = 0;
                if ((uVar32 ^ local_78) == 0xffffffffffffffff) {
                  iVar19 = sqlite3VdbeAddOp3(local_80,0x11,0,0,0);
                  sqlite3VdbeExplain(pParse,'\0',"USING INDEX %s FOR IN-OPERATOR",pIdx->zName);
                  sqlite3VdbeAddOp3(pVVar6,0x6c,(int)local_b0,pIdx->tnum,(int)local_88);
                  sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
                  bVar11 = *pIdx->aSortOrder;
                  if (local_a0 != (int *)0x0) {
                    iVar13 = pParse->nMem + 1;
                    pParse->nMem = iVar13;
                    *local_a0 = iVar13;
                    if (uVar25 == 1) {
                      sqlite3SetHasNullFlag(pVVar6,(int)local_b0,iVar13);
                    }
                  }
                  pOVar24 = (Op *)&sqlite3VdbeGetOp_dummy;
                  if (pVVar6->db->mallocFailed == '\0') {
                    iVar13 = pVVar6->nOp + -1;
                    if (-1 < iVar19) {
                      iVar13 = iVar19;
                    }
                    pOVar24 = local_80->aOp + iVar13;
                  }
                  iVar19 = bVar11 + 3;
                  pOVar24->p2 = pVVar6->nOp;
                }
              }
              pIdx = pIdx->pNext;
            } while ((pIdx != (Index *)0x0) && (iVar19 == 0));
            goto LAB_0019850f;
          }
        }
        else {
          pEVar28 = local_b8->a;
          uVar32 = 0;
          do {
            pEVar17 = sqlite3VectorFieldSubexpr(local_a8->pLeft,(int)uVar32);
            lVar22 = (long)pEVar28->pExpr->iColumn;
            if (lVar22 < 0) {
              cVar10 = 'D';
            }
            else {
              cVar10 = pTab->aCol[lVar22].affinity;
            }
            cVar12 = sqlite3CompareAffinity(pEVar17,cVar10);
            bVar33 = (byte)(cVar12 + 0xbfU) < 2;
            uVar32 = uVar32 + 1;
          } while ((uVar32 < uVar25) && (pEVar28 = pEVar28 + 1, 'B' < cVar10 || bVar33));
          if ('B' < cVar10 || bVar33) goto LAB_00198959;
        }
        iVar19 = 0;
      }
    }
  }
LAB_0019850f:
  piVar29 = local_90;
  pEVar17 = local_a8;
  if (((iVar19 == 0) && (iVar19 = 0, (inFlags & 1) != 0)) && ((local_a8->flags & 0x800) == 0)) {
    pEVar18 = local_a8->pLeft;
    local_a8->pLeft = (Expr *)0x0;
    local_68.eCode = '\x01';
    local_68.xExprCallback = exprNodeIsConstant;
    local_68.xSelectCallback = sqlite3SelectWalkFail;
    local_68.u.n = 0;
    if (local_a8 != (Expr *)0x0) {
      walkExpr(&local_68,local_a8);
    }
    pEVar17->pLeft = pEVar18;
    if ((local_68.eCode == '\0') || (((pEVar17->x).pList)->nExpr < 3)) {
      iVar19 = 5;
    }
  }
  if (iVar19 == 0) {
    local_78 = CONCAT44(local_78._4_4_,pParse->nQueryLoop);
    if ((inFlags & 4) == 0) {
      if (local_a0 == (int *)0x0) goto LAB_0019868a;
      local_c0 = pParse->nMem + 1;
      pParse->nMem = local_c0;
      *local_a0 = local_c0;
    }
    else {
      pParse->nQueryLoop = 0;
LAB_0019868a:
      local_c0 = 0;
    }
    pVVar6 = pParse->pVdbe;
    uVar25 = pEVar17->flags;
    local_b8 = (ExprList *)((ulong)local_b8 & 0xffffffff00000000);
    if (((uVar25 & 0x20) == 0) && (pParse->iSelfTab == 0)) {
      if ((uVar25 >> 0x19 & 1) == 0) {
        pEVar17->flags = uVar25 | 0x2000000;
        iVar19 = pParse->nMem + 1;
        pParse->nMem = iVar19;
        (pEVar17->y).sub.regReturn = iVar19;
        iVar19 = sqlite3VdbeAddOp3(pVVar6,0x46,0,iVar19,0);
        (pEVar17->y).sub.iAddr = iVar19 + 1;
        iVar19 = sqlite3VdbeAddOp3(pVVar6,0x11,0,0,0);
        local_b8 = (ExprList *)CONCAT44(local_b8._4_4_,iVar19);
        goto LAB_001986fb;
      }
      iVar19 = sqlite3VdbeAddOp3(pVVar6,0x11,0,0,0);
      if ((pEVar17->flags & 0x800) != 0) {
        sqlite3VdbeExplain(pParse,'\0',"REUSE LIST SUBQUERY %d",(ulong)((pEVar17->x).pSelect)->selId
                          );
      }
      sqlite3VdbeAddOp3(pVVar6,0xc,(pEVar17->y).sub.regReturn,(pEVar17->y).sub.iAddr,0);
      sqlite3VdbeAddOp3(pVVar6,0x6f,(int)local_b0,pEVar17->iTable,0);
      if (pVVar6->db->mallocFailed == '\0') {
        iVar13 = pVVar6->nOp + -1;
        if (-1 < iVar19) {
          iVar13 = iVar19;
        }
        pOVar24 = pVVar6->aOp + iVar13;
      }
      else {
        pOVar24 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar24->p2 = pVVar6->nOp;
    }
    else {
LAB_001986fb:
      local_88 = pEVar17->pLeft;
      uVar9 = local_88->op;
      if (uVar9 == 0xa8) {
        uVar9 = local_88->op2;
      }
      if (uVar9 == 0x83) {
        pSVar15 = (local_88->x).pSelect;
LAB_00198725:
        uVar25 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar15->pEList)->pList->nExpr;
      }
      else {
        uVar25 = 1;
        if (uVar9 == 0xa9) {
          pSVar15 = (Select *)&local_88->x;
          goto LAB_00198725;
        }
      }
      pEVar17->iTable = (int)local_b0;
      iVar19 = sqlite3VdbeAddOp3(pVVar6,0x71,(int)local_b0,uVar25,0);
      local_a0 = (int *)CONCAT44(local_a0._4_4_,iVar19);
      local_98 = sqlite3KeyInfoAlloc(pParse->db,uVar25,1);
      pSVar15 = (pEVar17->x).pSelect;
      if ((pEVar17->flags & 0x800) == 0) {
        if (pSVar15 != (Select *)0x0) {
          cVar10 = sqlite3ExprAffinity(local_88);
          pKVar8 = local_98;
          local_b9 = 'A';
          if (cVar10 != '\0') {
            local_b9 = cVar10;
          }
          if (local_98 != (KeyInfo *)0x0) {
            pCVar16 = sqlite3ExprCollSeq(pParse,pEVar17->pLeft);
            pKVar8->aColl[0] = pCVar16;
          }
          if (pParse->nTempReg == '\0') {
            iVar19 = pParse->nMem + 1;
            pParse->nMem = iVar19;
          }
          else {
            bVar11 = pParse->nTempReg - 1;
            pParse->nTempReg = bVar11;
            iVar19 = pParse->aTempReg[bVar11];
          }
          if (pParse->nTempReg == '\0') {
            iVar13 = pParse->nMem + 1;
            pParse->nMem = iVar13;
          }
          else {
            bVar11 = pParse->nTempReg - 1;
            pParse->nTempReg = bVar11;
            iVar13 = pParse->aTempReg[bVar11];
          }
          if (0 < *(int *)&pSVar15->pEList) {
            ppSVar30 = (SrcList **)&pSVar15->op;
            iVar27 = *(int *)&pSVar15->pEList + 1;
            do {
              pSVar7 = *ppSVar30;
              if ((int)local_b8 == 0) {
LAB_00198cf6:
                local_b8 = (ExprList *)((ulong)local_b8 & 0xffffffff00000000);
              }
              else {
                local_68.eCode = '\x01';
                local_68.xExprCallback = exprNodeIsConstant;
                local_68.xSelectCallback = sqlite3SelectWalkFail;
                local_68.u.n = 0;
                if (pSVar7 != (SrcList *)0x0) {
                  walkExpr(&local_68,(Expr *)pSVar7);
                }
                if (local_68.eCode == '\0') {
                  sqlite3VdbeChangeToNoop(pVVar6,(int)local_b8);
                  pbVar1 = (byte *)((long)&local_a8->flags + 3);
                  *pbVar1 = *pbVar1 & 0xfd;
                  goto LAB_00198cf6;
                }
              }
              iVar14 = sqlite3ExprCodeTarget(pParse,(Expr *)pSVar7,iVar19);
              addr = sqlite3VdbeAddOp3(pVVar6,0x5c,iVar14,1,iVar13);
              sqlite3VdbeChangeP4(pVVar6,addr,&local_b9,1);
              iVar14 = sqlite3VdbeAddOp3(pVVar6,0x84,(int)local_b0,iVar13,iVar14);
              if (pVVar6->db->mallocFailed == '\0') {
                pOVar24 = pVVar6->aOp;
                pOVar24[iVar14].p4type = -3;
                pOVar24[iVar14].p4.i = 1;
              }
              ppSVar30 = ppSVar30 + 4;
              iVar27 = iVar27 + -1;
            } while (1 < iVar27);
          }
          if (iVar19 != 0) {
            bVar11 = pParse->nTempReg;
            if ((ulong)bVar11 < 8) {
              pParse->nTempReg = bVar11 + 1;
              pParse->aTempReg[bVar11] = iVar19;
            }
          }
          piVar29 = local_90;
          pEVar17 = local_a8;
          if (iVar13 != 0) {
            bVar11 = pParse->nTempReg;
            if ((ulong)bVar11 < 8) {
              pParse->nTempReg = bVar11 + 1;
              pParse->aTempReg[bVar11] = iVar13;
            }
          }
        }
      }
      else {
        pEVar4 = pSVar15->pEList;
        pcVar21 = "";
        if ((int)local_b8 == 0) {
          pcVar21 = "CORRELATED ";
        }
        sqlite3VdbeExplain(pParse,'\x01',"%sLIST SUBQUERY %d",pcVar21);
        piVar29 = local_90;
        pEVar17 = local_a8;
        if (pEVar4->nExpr == uVar25) {
          local_68.pParse._0_1_ = 0xb;
          local_68.pParse._4_4_ = (undefined4)local_b0;
          local_68.xExprCallback = (_func_int_Walker_ptr_Expr_ptr *)0x0;
          local_68.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
          local_68.xSelectCallback =
               (_func_int_Walker_ptr_Select_ptr *)exprINAffinity(pParse,local_a8);
          pSVar15->iLimit = 0;
          local_6c = sqlite3Select(pParse,pSVar15,(SelectDest *)&local_68);
          pKVar8 = local_98;
          if (local_6c == 0) {
            if (local_68.xSelectCallback != (_func_int_Walker_ptr_Select_ptr *)0x0) {
              sqlite3DbFreeNN(pParse->db,local_68.xSelectCallback);
            }
            pEVar17 = local_88;
            if (0 < (int)uVar25) {
              pEVar28 = pEVar4->a;
              uVar32 = 0;
              do {
                pEVar18 = sqlite3VectorFieldSubexpr(pEVar17,(int)uVar32);
                pCVar16 = sqlite3BinaryCompareCollSeq(pParse,pEVar18,pEVar28->pExpr);
                pKVar8->aColl[uVar32] = pCVar16;
                uVar32 = uVar32 + 1;
                pEVar28 = pEVar28 + 1;
              } while (uVar25 != uVar32);
            }
          }
          else {
            if (local_68.xSelectCallback != (_func_int_Walker_ptr_Select_ptr *)0x0) {
              sqlite3DbFreeNN(pParse->db,local_68.xSelectCallback);
            }
            if ((pKVar8 != (KeyInfo *)0x0) && (pKVar8->nRef = pKVar8->nRef - 1, pKVar8->nRef == 0))
            {
              sqlite3DbFreeNN(pKVar8->db,pKVar8);
            }
          }
          piVar29 = local_90;
          pEVar17 = local_a8;
          if (local_6c != 0) goto LAB_00198fca;
        }
      }
      if (local_98 != (KeyInfo *)0x0) {
        sqlite3VdbeChangeP4(pVVar6,(int)local_a0,(char *)local_98,-9);
      }
      if ((int)local_b8 != 0) {
        pOVar31 = (Op *)&sqlite3VdbeGetOp_dummy;
        pOVar24 = (Op *)&sqlite3VdbeGetOp_dummy;
        if (pVVar6->db->mallocFailed == '\0') {
          iVar19 = pVVar6->nOp + -1;
          if (-1 < (int)local_b8) {
            iVar19 = (int)local_b8;
          }
          pOVar24 = pVVar6->aOp + iVar19;
        }
        pOVar24->p2 = pVVar6->nOp;
        sqlite3VdbeAddOp3(pVVar6,0x42,(pEVar17->y).sub.regReturn,0,0);
        iVar19 = pVVar6->nOp + -1;
        if (pVVar6->db->mallocFailed == '\0') {
          iVar13 = (pEVar17->y).sub.iAddr;
          iVar27 = iVar13 + -1;
          if (iVar13 < 1) {
            iVar27 = iVar19;
          }
          pOVar31 = pVVar6->aOp + iVar27;
        }
        pOVar31->p1 = iVar19;
      }
    }
LAB_00198fca:
    if (local_c0 != 0) {
      sqlite3SetHasNullFlag(local_80,(int)local_b0,local_c0);
    }
    pParse->nQueryLoop = (u32)local_78;
    iVar19 = 2;
  }
  if ((piVar29 == (int *)0x0) || (0xfffffffd < iVar19 - 5U)) goto LAB_00199044;
  pEVar17 = pEVar17->pLeft;
  uVar9 = pEVar17->op;
  if (uVar9 == 0xa8) {
    uVar9 = pEVar17->op2;
  }
  if (uVar9 == 0x83) {
    pSVar15 = (pEVar17->x).pSelect;
LAB_0019902b:
    uVar25 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar15->pEList)->pList->nExpr;
  }
  else {
    uVar25 = 1;
    if (uVar9 == 0xa9) {
      pSVar15 = (Select *)&pEVar17->x;
      goto LAB_0019902b;
    }
  }
  if (0 < (int)uVar25) {
    uVar32 = 0;
    do {
      piVar29[uVar32] = (int)uVar32;
      uVar32 = uVar32 + 1;
    } while (uVar25 != uVar32);
  }
LAB_00199044:
  *local_38 = (int)local_b0;
  return iVar19;
LAB_00198a5e:
  if (bVar11 == bVar2) goto LAB_00198a6e;
LAB_00198a63:
  uVar23 = uVar23 + 1;
  if (uVar23 == uVar25) goto code_r0x00198a6b;
  goto LAB_00198a20;
code_r0x00198a6b:
  uVar23 = (ulong)uVar25;
LAB_00198a6e:
  if (((uint)uVar23 == uVar25) || ((uVar32 >> (uVar23 & 0x3f) & 1) != 0)) {
    bVar33 = false;
  }
  else {
    uVar32 = uVar32 | 1L << ((byte)uVar23 & 0x3f);
    bVar33 = true;
    if (local_90 != (int *)0x0) {
      local_90[lVar22] = (uint)uVar23;
    }
  }
  if ((!bVar33) || (lVar22 = lVar22 + 1, (long)local_98 <= lVar22)) goto LAB_00198ade;
  goto LAB_001989e5;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindInIndex(
  Parse *pParse,             /* Parsing context */
  Expr *pX,                  /* The right-hand side (RHS) of the IN operator */
  u32 inFlags,               /* IN_INDEX_LOOP, _MEMBERSHIP, and/or _NOOP_OK */
  int *prRhsHasNull,         /* Register holding NULL status.  See notes */
  int *aiMap,                /* Mapping from Index fields to RHS fields */
  int *piTab                 /* OUT: index to use */
){
  Select *p;                            /* SELECT to the right of IN operator */
  int eType = 0;                        /* Type of RHS table. IN_INDEX_* */
  int iTab = pParse->nTab++;            /* Cursor of the RHS table */
  int mustBeUnique;                     /* True if RHS must be unique */
  Vdbe *v = sqlite3GetVdbe(pParse);     /* Virtual machine being coded */

  assert( pX->op==TK_IN );
  mustBeUnique = (inFlags & IN_INDEX_LOOP)!=0;

  /* If the RHS of this IN(...) operator is a SELECT, and if it matters 
  ** whether or not the SELECT result contains NULL values, check whether
  ** or not NULL is actually possible (it may not be, for example, due 
  ** to NOT NULL constraints in the schema). If no NULL values are possible,
  ** set prRhsHasNull to 0 before continuing.  */
  if( prRhsHasNull && (pX->flags & EP_xIsSelect) ){
    int i;
    ExprList *pEList = pX->x.pSelect->pEList;
    for(i=0; i<pEList->nExpr; i++){
      if( sqlite3ExprCanBeNull(pEList->a[i].pExpr) ) break;
    }
    if( i==pEList->nExpr ){
      prRhsHasNull = 0;
    }
  }

  /* Check to see if an existing table or index can be used to
  ** satisfy the query.  This is preferable to generating a new 
  ** ephemeral table.  */
  if( pParse->nErr==0 && (p = isCandidateForInOpt(pX))!=0 ){
    sqlite3 *db = pParse->db;              /* Database connection */
    Table *pTab;                           /* Table <table>. */
    i16 iDb;                               /* Database idx for pTab */
    ExprList *pEList = p->pEList;
    int nExpr = pEList->nExpr;

    assert( p->pEList!=0 );             /* Because of isCandidateForInOpt(p) */
    assert( p->pEList->a[0].pExpr!=0 ); /* Because of isCandidateForInOpt(p) */
    assert( p->pSrc!=0 );               /* Because of isCandidateForInOpt(p) */
    pTab = p->pSrc->a[0].pTab;

    /* Code an OP_Transaction and OP_TableLock for <table>. */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    sqlite3CodeVerifySchema(pParse, iDb);
    sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);

    assert(v);  /* sqlite3GetVdbe() has always been previously called */
    if( nExpr==1 && pEList->a[0].pExpr->iColumn<0 ){
      /* The "x IN (SELECT rowid FROM table)" case */
      int iAddr = sqlite3VdbeAddOp0(v, OP_Once);
      VdbeCoverage(v);

      sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
      eType = IN_INDEX_ROWID;
      ExplainQueryPlan((pParse, 0,
            "USING ROWID SEARCH ON TABLE %s FOR IN-OPERATOR",pTab->zName));
      sqlite3VdbeJumpHere(v, iAddr);
    }else{
      Index *pIdx;                         /* Iterator variable */
      int affinity_ok = 1;
      int i;

      /* Check that the affinity that will be used to perform each 
      ** comparison is the same as the affinity of each column in table
      ** on the RHS of the IN operator.  If it not, it is not possible to
      ** use any index of the RHS table.  */
      for(i=0; i<nExpr && affinity_ok; i++){
        Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
        int iCol = pEList->a[i].pExpr->iColumn;
        char idxaff = sqlite3TableColumnAffinity(pTab,iCol); /* RHS table */
        char cmpaff = sqlite3CompareAffinity(pLhs, idxaff);
        testcase( cmpaff==SQLITE_AFF_BLOB );
        testcase( cmpaff==SQLITE_AFF_TEXT );
        switch( cmpaff ){
          case SQLITE_AFF_BLOB:
            break;
          case SQLITE_AFF_TEXT:
            /* sqlite3CompareAffinity() only returns TEXT if one side or the
            ** other has no affinity and the other side is TEXT.  Hence,
            ** the only way for cmpaff to be TEXT is for idxaff to be TEXT
            ** and for the term on the LHS of the IN to have no affinity. */
            assert( idxaff==SQLITE_AFF_TEXT );
            break;
          default:
            affinity_ok = sqlite3IsNumericAffinity(idxaff);
        }
      }

      if( affinity_ok ){
        /* Search for an existing index that will work for this IN operator */
        for(pIdx=pTab->pIndex; pIdx && eType==0; pIdx=pIdx->pNext){
          Bitmask colUsed;      /* Columns of the index used */
          Bitmask mCol;         /* Mask for the current column */
          if( pIdx->nColumn<nExpr ) continue;
          if( pIdx->pPartIdxWhere!=0 ) continue;
          /* Maximum nColumn is BMS-2, not BMS-1, so that we can compute
          ** BITMASK(nExpr) without overflowing */
          testcase( pIdx->nColumn==BMS-2 );
          testcase( pIdx->nColumn==BMS-1 );
          if( pIdx->nColumn>=BMS-1 ) continue;
          if( mustBeUnique ){
            if( pIdx->nKeyCol>nExpr
             ||(pIdx->nColumn>nExpr && !IsUniqueIndex(pIdx))
            ){
              continue;  /* This index is not unique over the IN RHS columns */
            }
          }
  
          colUsed = 0;   /* Columns of index used so far */
          for(i=0; i<nExpr; i++){
            Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
            Expr *pRhs = pEList->a[i].pExpr;
            CollSeq *pReq = sqlite3BinaryCompareCollSeq(pParse, pLhs, pRhs);
            int j;
  
            assert( pReq!=0 || pRhs->iColumn==XN_ROWID || pParse->nErr );
            for(j=0; j<nExpr; j++){
              if( pIdx->aiColumn[j]!=pRhs->iColumn ) continue;
              assert( pIdx->azColl[j] );
              if( pReq!=0 && sqlite3StrICmp(pReq->zName, pIdx->azColl[j])!=0 ){
                continue;
              }
              break;
            }
            if( j==nExpr ) break;
            mCol = MASKBIT(j);
            if( mCol & colUsed ) break; /* Each column used only once */
            colUsed |= mCol;
            if( aiMap ) aiMap[i] = j;
          }
  
          assert( i==nExpr || colUsed!=(MASKBIT(nExpr)-1) );
          if( colUsed==(MASKBIT(nExpr)-1) ){
            /* If we reach this point, that means the index pIdx is usable */
            int iAddr = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
            ExplainQueryPlan((pParse, 0,
                              "USING INDEX %s FOR IN-OPERATOR",pIdx->zName));
            sqlite3VdbeAddOp3(v, OP_OpenRead, iTab, pIdx->tnum, iDb);
            sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
            VdbeComment((v, "%s", pIdx->zName));
            assert( IN_INDEX_INDEX_DESC == IN_INDEX_INDEX_ASC+1 );
            eType = IN_INDEX_INDEX_ASC + pIdx->aSortOrder[0];
  
            if( prRhsHasNull ){
#ifdef SQLITE_ENABLE_COLUMN_USED_MASK
              i64 mask = (1<<nExpr)-1;
              sqlite3VdbeAddOp4Dup8(v, OP_ColumnsUsed, 
                  iTab, 0, 0, (u8*)&mask, P4_INT64);
#endif
              *prRhsHasNull = ++pParse->nMem;
              if( nExpr==1 ){
                sqlite3SetHasNullFlag(v, iTab, *prRhsHasNull);
              }
            }
            sqlite3VdbeJumpHere(v, iAddr);
          }
        } /* End loop over indexes */
      } /* End if( affinity_ok ) */
    } /* End if not an rowid index */
  } /* End attempt to optimize using an index */

  /* If no preexisting index is available for the IN clause
  ** and IN_INDEX_NOOP is an allowed reply
  ** and the RHS of the IN operator is a list, not a subquery
  ** and the RHS is not constant or has two or fewer terms,
  ** then it is not worth creating an ephemeral table to evaluate
  ** the IN operator so return IN_INDEX_NOOP.
  */
  if( eType==0
   && (inFlags & IN_INDEX_NOOP_OK)
   && !ExprHasProperty(pX, EP_xIsSelect)
   && (!sqlite3InRhsIsConstant(pX) || pX->x.pList->nExpr<=2)
  ){
    eType = IN_INDEX_NOOP;
  }

  if( eType==0 ){
    /* Could not find an existing table or index to use as the RHS b-tree.
    ** We will have to generate an ephemeral table to do the job.
    */
    u32 savedNQueryLoop = pParse->nQueryLoop;
    int rMayHaveNull = 0;
    eType = IN_INDEX_EPH;
    if( inFlags & IN_INDEX_LOOP ){
      pParse->nQueryLoop = 0;
    }else if( prRhsHasNull ){
      *prRhsHasNull = rMayHaveNull = ++pParse->nMem;
    }
    assert( pX->op==TK_IN );
    sqlite3CodeRhsOfIN(pParse, pX, iTab);
    if( rMayHaveNull ){
      sqlite3SetHasNullFlag(v, iTab, rMayHaveNull);
    }
    pParse->nQueryLoop = savedNQueryLoop;
  }

  if( aiMap && eType!=IN_INDEX_INDEX_ASC && eType!=IN_INDEX_INDEX_DESC ){
    int i, n;
    n = sqlite3ExprVectorSize(pX->pLeft);
    for(i=0; i<n; i++) aiMap[i] = i;
  }
  *piTab = iTab;
  return eType;
}